

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cc
# Opt level: O2

optional<kratos::BuiltinFunctionInfo> *
kratos::get_builtin_function_info
          (optional<kratos::BuiltinFunctionInfo> *__return_storage_ptr__,string *name)

{
  undefined8 uVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)builtin_functions_info_abi_cxx11_,name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>,_true>
      ._M_cur != (__node_type *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)builtin_functions_info_abi_cxx11_,name);
    uVar1 = *(undefined8 *)&pmVar3->min_num_args;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>).
      _M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload =
         *(undefined8 *)pmVar3;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>)
             ._M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload + 8) =
         uVar1;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>)
             ._M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload + 0x10
     ) = *(undefined4 *)&pmVar3->signed_;
  }
  (__return_storage_ptr__->super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>)._M_payload
  .super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_engaged =
       iVar2.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::BuiltinFunctionInfo>,_true>
       ._M_cur != (__node_type *)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<BuiltinFunctionInfo> get_builtin_function_info(const std::string &name) {
    if (builtin_functions_info.find(name) != builtin_functions_info.end()) {
        return builtin_functions_info.at(name);
    } else {
        return std::nullopt;
    }
}